

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O0

void Imf_3_4::Attribute::unRegisterAttributeType(char *typeName)

{
  lock_guard<std::mutex> lock;
  LockedTypeMap *tMap;
  mutex_type *in_stack_ffffffffffffffd8;
  map<const_char_*,_Imf_3_4::Attribute_*(*)(),_Imf_3_4::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_4::Attribute_*(*)()>_>_>
  *in_stack_ffffffffffffffe0;
  
  anon_unknown_0::typeMap();
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::
  map<const_char_*,_Imf_3_4::Attribute_*(*)(),_Imf_3_4::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_4::Attribute_*(*)()>_>_>
  ::erase(in_stack_ffffffffffffffe0,(key_type *)in_stack_ffffffffffffffd8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x174ff1);
  return;
}

Assistant:

void
Attribute::unRegisterAttributeType (const char typeName[])
{
    LockedTypeMap& tMap = typeMap ();
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (tMap.mutex);
#endif
    tMap.erase (typeName);
}